

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O3

ptr<Value> __thiscall Operation::asDoubles(Operation *this,double leftOperand,double rightOperand)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_38;
  
  puVar5 = (undefined4 *)__cxa_allocate_exception(SUB84(leftOperand,0),0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Operation not defined for Double type","");
  ExceptionObjects::undefined_operation((ExceptionObjects *)&local_48,&local_38);
  uVar1 = (undefined4)local_48;
  uVar2 = local_48._4_4_;
  uVar3 = (undefined4)uStack_40;
  uVar4 = uStack_40._4_4_;
  local_48 = 0;
  uStack_40 = 0;
  *puVar5 = uVar1;
  puVar5[1] = uVar2;
  puVar5[2] = uVar3;
  puVar5[3] = uVar4;
  __cxa_throw(puVar5,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> Operation::asDoubles(double leftOperand, double rightOperand) {
    throw ThrowPacket(ExceptionObjects::undefined_operation("Operation not defined for Double type"));
}